

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_handle_custom_dialogues.hpp
# Opt level: O0

void __thiscall
PatchHandleCustomDialogues::inject_data(PatchHandleCustomDialogues *this,ROM *rom,World *world)

{
  World *this_00;
  uint32_t uVar1;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  World *local_20;
  World *world_local;
  ROM *rom_local;
  PatchHandleCustomDialogues *this_local;
  
  local_20 = world;
  world_local = (World *)rom;
  rom_local = (ROM *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  uVar1 = md::ROM::inject_bytes
                    (rom,&(this->_custom_text_lut).
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_40);
  this->_custom_text_lut_addr = uVar1;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  this_00 = world_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
  uVar1 = md::ROM::inject_bytes
                    ((ROM *)this_00,
                     &(this->_custom_text_script_words).
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_78);
  this->_custom_text_script_words_addr = uVar1;
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  return;
}

Assistant:

void inject_data(md::ROM& rom, World& world) override
    {
        _custom_text_lut_addr = rom.inject_bytes(_custom_text_lut);
        _custom_text_script_words_addr = rom.inject_bytes(_custom_text_script_words);
    }